

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

int Gia_ManSetLevels(Gia_Man_t *p,Vec_Int_t *vCiLevels)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  int Fill;
  int extraout_EDX;
  int extraout_EDX_00;
  undefined8 extraout_RDX;
  undefined8 uVar9;
  undefined8 extraout_RDX_00;
  long lVar10;
  long lVar11;
  
  if (vCiLevels == (Vec_Int_t *)0x0) {
    iVar6 = Gia_ManLevelNum(p);
    return iVar6;
  }
  if (vCiLevels->nSize != p->vCis->nSize) {
    __assert_fail("Vec_IntSize(vCiLevels) == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x234,"int Gia_ManSetLevels(Gia_Man_t *, Vec_Int_t *)");
  }
  Gia_ManCleanLevels(p,p->nObjs);
  p->nLevels = 0;
  pVVar7 = p->vCis;
  if (0 < pVVar7->nSize) {
    lVar11 = 0;
    uVar9 = extraout_RDX;
    do {
      iVar6 = pVVar7->pArray[lVar11];
      lVar10 = (long)iVar6;
      if ((lVar10 < 0) || (p->nObjs <= iVar6)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      if (vCiLevels->nSize <= lVar11) goto LAB_0023f900;
      iVar5 = vCiLevels->pArray[lVar11];
      pVVar7 = p->vLevels;
      Vec_IntFillExtra(pVVar7,iVar6 + 1,(int)uVar9);
      if (pVVar7->nSize <= iVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      pGVar1 = pGVar1 + lVar10;
      pVVar7->pArray[lVar10] = iVar5;
      pGVar2 = p->pObjs;
      if ((pGVar1 < pGVar2) || (pGVar2 + p->nObjs <= pGVar1)) goto LAB_0023f91f;
      iVar6 = p->nLevels;
      uVar4 = (int)((long)pGVar1 - (long)pGVar2 >> 2) * -0x55555555;
      pVVar7 = p->vLevels;
      Vec_IntFillExtra(pVVar7,uVar4 + 1,Fill);
      if (((int)uVar4 < 0) || (pVVar7->nSize <= (int)uVar4)) goto LAB_0023f900;
      iVar5 = pVVar7->pArray[uVar4 & 0x7fffffff];
      if (pVVar7->pArray[uVar4 & 0x7fffffff] < iVar6) {
        iVar5 = iVar6;
      }
      p->nLevels = iVar5;
      lVar11 = lVar11 + 1;
      pVVar7 = p->vCis;
      uVar9 = extraout_RDX_00;
    } while (lVar11 < pVVar7->nSize);
  }
  if (0 < p->nObjs) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      pGVar1 = p->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) break;
      pGVar2 = (Gia_Obj_t *)(&pGVar1->field_0x0 + lVar10);
      iVar6 = (int)*(ulong *)pGVar2;
      uVar8 = *(ulong *)pGVar2 & 0x1fffffff;
      if (uVar8 == 0x1fffffff || iVar6 < 0) {
        if (iVar6 < 0 && (int)uVar8 != 0x1fffffff) {
          Gia_ObjSetCoLevel(p,pGVar2);
          iVar6 = extraout_EDX_00;
          goto LAB_0023f845;
        }
      }
      else {
        Gia_ObjSetGateLevel(p,pGVar2);
        iVar6 = extraout_EDX;
LAB_0023f845:
        pGVar3 = p->pObjs;
        if ((pGVar2 < pGVar3) || (pGVar3 + p->nObjs <= pGVar2)) {
LAB_0023f91f:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        iVar5 = p->nLevels;
        uVar4 = (int)((long)pGVar1 + (lVar10 - (long)pGVar3) >> 2) * -0x55555555;
        pVVar7 = p->vLevels;
        Vec_IntFillExtra(pVVar7,uVar4 + 1,iVar6);
        if (((int)uVar4 < 0) || (pVVar7->nSize <= (int)uVar4)) {
LAB_0023f900:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        iVar6 = pVVar7->pArray[uVar4 & 0x7fffffff];
        if (pVVar7->pArray[uVar4 & 0x7fffffff] < iVar5) {
          iVar6 = iVar5;
        }
        p->nLevels = iVar6;
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0xc;
    } while (lVar11 < p->nObjs);
  }
  return p->nLevels;
}

Assistant:

int Gia_ManSetLevels( Gia_Man_t * p, Vec_Int_t * vCiLevels )  
{
    Gia_Obj_t * pObj;
    int i;
    if ( vCiLevels == NULL )
        return Gia_ManLevelNum( p );
    assert( Vec_IntSize(vCiLevels) == Gia_ManCiNum(p) );
    Gia_ManCleanLevels( p, Gia_ManObjNum(p) );
    p->nLevels = 0;
    Gia_ManForEachCi( p, pObj, i )
    {
        Gia_ObjSetLevel( p, pObj, Vec_IntEntry(vCiLevels, i) );
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ObjSetGateLevel( p, pObj );
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjSetCoLevel( p, pObj );
        else continue;
        p->nLevels = Abc_MaxInt( p->nLevels, Gia_ObjLevel(p, pObj) );
    }
    return p->nLevels;
}